

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::gjInverse(Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  float *pfVar16;
  long lVar17;
  undefined4 *puVar18;
  undefined8 *puVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  float *pfVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float local_b8 [6];
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 local_7c;
  undefined8 uStack_78;
  Matrix44<float> s;
  
  pfVar15 = s.x[2] + 2;
  pfVar13 = local_b8;
  local_b8[0] = 1.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 1.0;
  uStack_a0 = 0;
  uStack_98 = 0;
  local_90 = 0x3f800000;
  local_8c = 0;
  uStack_88 = 0;
  uStack_84 = 0;
  uStack_80 = 0;
  local_7c = 0x3f800000;
  pfVar12 = s.x[0] + 2;
  uStack_78 = *(undefined8 *)this->x[0];
  s.x[0]._0_8_ = *(undefined8 *)(this->x[0] + 2);
  s.x[0]._8_8_ = *(undefined8 *)this->x[1];
  s.x[1]._0_8_ = *(undefined8 *)(this->x[1] + 2);
  s.x[1]._8_8_ = *(undefined8 *)this->x[2];
  s.x[2]._0_8_ = *(undefined8 *)(this->x[2] + 2);
  s.x[2]._8_8_ = *(undefined8 *)this->x[3];
  s.x[3]._0_8_ = *(undefined8 *)(this->x[3] + 2);
  fVar25 = __return_storage_ptr__->x[0][0];
  fVar28 = __return_storage_ptr__->x[1][1];
  pfVar1 = __return_storage_ptr__->x[0] + 1;
  pfVar2 = __return_storage_ptr__->x[1] + 2;
  pfVar3 = __return_storage_ptr__->x[2] + 3;
  fVar27 = __return_storage_ptr__->x[2][2];
  fVar26 = __return_storage_ptr__->x[3][3];
  lVar17 = -3;
  puVar19 = &uStack_78;
  uVar20 = 0;
LAB_00157b16:
  if (uVar20 == 3) {
    __return_storage_ptr__->x[1][1] = fVar28;
    __return_storage_ptr__->x[2][2] = fVar27;
    __return_storage_ptr__->x[3][3] = fVar26;
    __return_storage_ptr__->x[0][0] = fVar25;
    lVar17 = 3;
    puVar18 = &uStack_88;
    while( true ) {
      fVar6 = *(float *)((long)s.x + lVar17 * 0x14 + -8);
      if ((fVar6 != 0.0) || (NAN(fVar6))) {
        auVar33._4_4_ = fVar6;
        auVar33._0_4_ = fVar6;
        auVar33._8_4_ = fVar6;
        auVar33._12_4_ = fVar6;
        auVar33 = divps(*(undefined1 (*) [16])(s.x[lVar17 + -1] + 2),auVar33);
        *(undefined1 (*) [16])(s.x[lVar17 + -1] + 2) = auVar33;
        auVar8._4_4_ = fVar6;
        auVar8._0_4_ = fVar6;
        auVar8._8_4_ = fVar6;
        auVar8._12_4_ = fVar6;
        auVar33 = divps(*(undefined1 (*) [16])(local_b8 + lVar17 * 4),auVar8);
        *(undefined1 (*) [16])(local_b8 + lVar17 * 4) = auVar33;
        if (lVar17 != 0) {
          lVar22 = 0;
          pfVar13 = local_b8;
          puVar19 = &uStack_78;
          do {
            fVar31 = -s.x[lVar22 + -1][lVar17 + 2];
            lVar14 = 0;
            do {
              fVar29 = *(float *)((long)puVar18 + lVar14);
              fVar7 = *(float *)((long)pfVar13 + lVar14);
              *(float *)((long)puVar19 + lVar14) =
                   *(float *)((long)pfVar15 + lVar14) * fVar31 + *(float *)((long)puVar19 + lVar14);
              *(float *)((long)pfVar13 + lVar14) = fVar29 * fVar31 + fVar7;
              lVar14 = lVar14 + 4;
            } while (lVar14 != 0x10);
            lVar22 = lVar22 + 1;
            puVar19 = puVar19 + 2;
            pfVar13 = pfVar13 + 4;
          } while (lVar22 != lVar17);
        }
      }
      else {
        pfVar1[0] = 0.0;
        pfVar1[1] = 0.0;
        *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
        pfVar2[0] = 0.0;
        pfVar2[1] = 0.0;
        *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
        *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
        *(undefined8 *)pfVar3 = 0;
        *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
        *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
        fVar26 = 1.0;
        fVar27 = 1.0;
        fVar28 = 1.0;
        fVar25 = 1.0;
      }
      if ((fVar6 == 0.0) && (!NAN(fVar6))) break;
      pfVar15 = (float *)((long)pfVar15 + -0x10);
      puVar18 = puVar18 + -4;
      bVar24 = lVar17 == 0;
      lVar17 = lVar17 + -1;
      if (bVar24) {
        __return_storage_ptr__->x[1][1] = fVar28;
        __return_storage_ptr__->x[2][2] = fVar27;
        __return_storage_ptr__->x[3][3] = fVar26;
        __return_storage_ptr__->x[0][0] = fVar25;
        *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(local_b8[1],local_b8[0]);
        *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(local_b8[3],local_b8[2]);
        *(ulong *)__return_storage_ptr__->x[1] = CONCAT44(local_b8[5],local_b8[4]);
        *(undefined8 *)(__return_storage_ptr__->x[1] + 2) = uStack_a0;
        *(undefined8 *)__return_storage_ptr__->x[2] = uStack_98;
        *(ulong *)(__return_storage_ptr__->x[2] + 2) = CONCAT44(local_8c,local_90);
        *(ulong *)__return_storage_ptr__->x[3] = CONCAT44(uStack_84,uStack_88);
        *(ulong *)(__return_storage_ptr__->x[3] + 2) = CONCAT44(local_7c,uStack_80);
        return __return_storage_ptr__;
      }
    }
  }
  else {
    pfVar23 = s.x[uVar20 - 1] + 2;
    uVar4 = uVar20 + 1;
    fVar6 = pfVar23[uVar20];
    fVar31 = -fVar6;
    if (-fVar6 <= fVar6) {
      fVar31 = fVar6;
    }
    uVar21 = uVar20 & 0xffffffff;
    pfVar16 = pfVar12;
    lVar22 = lVar17;
    do {
      fVar6 = *pfVar16;
      fVar29 = -fVar6;
      if (-fVar6 <= fVar6) {
        fVar29 = fVar6;
      }
      if (fVar31 < fVar29) {
        uVar21 = (ulong)((int)lVar22 + 4);
        fVar31 = fVar29;
      }
      pfVar16 = pfVar16 + 4;
      lVar22 = lVar22 + 1;
    } while (lVar22 != 0);
    if ((fVar31 != 0.0) || (NAN(fVar31))) {
      if (uVar20 != uVar21) {
        lVar22 = (long)(int)uVar21;
        lVar14 = 0;
        do {
          fVar6 = *(float *)((long)puVar19 + lVar14 * 4);
          *(float *)((long)puVar19 + lVar14 * 4) = s.x[lVar22 + -1][lVar14 + 2];
          s.x[lVar22 + -1][lVar14 + 2] = fVar6;
          fVar6 = pfVar13[lVar14];
          pfVar13[lVar14] = local_b8[lVar22 * 4 + lVar14];
          local_b8[lVar22 * 4 + lVar14] = fVar6;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
      }
      lVar22 = 0x10;
      uVar21 = uVar20;
      do {
        fVar30 = -*(float *)((long)pfVar12 + lVar22 + -0x10) / pfVar23[uVar20];
        pfVar16 = (float *)((long)puVar19 + lVar22);
        auVar32._0_4_ = *pfVar23 * fVar30 + *pfVar16;
        auVar32._4_4_ = s.x[uVar20 - 1][3] * fVar30 + pfVar16[1];
        auVar32._8_4_ = s.x[uVar20][0] * fVar30 + pfVar16[2];
        auVar32._12_4_ = s.x[uVar20][1] * fVar30 + pfVar16[3];
        *(undefined1 (*) [16])((long)puVar19 + lVar22) = auVar32;
        fVar6 = local_b8[uVar20 * 4 + 1];
        fVar29 = local_b8[uVar20 * 4 + 2];
        fVar7 = local_b8[uVar20 * 4 + 3];
        pfVar16 = (float *)((long)pfVar13 + lVar22);
        fVar9 = pfVar16[1];
        fVar10 = pfVar16[2];
        fVar11 = pfVar16[3];
        pfVar5 = (float *)((long)pfVar13 + lVar22);
        *pfVar5 = fVar30 * local_b8[uVar20 * 4] + *pfVar16;
        pfVar5[1] = fVar30 * fVar6 + fVar9;
        pfVar5[2] = fVar30 * fVar29 + fVar10;
        pfVar5[3] = fVar30 * fVar7 + fVar11;
        lVar22 = lVar22 + 0x10;
        uVar21 = uVar21 + 1;
      } while (uVar21 < 3);
    }
    else {
      pfVar1[0] = 0.0;
      pfVar1[1] = 0.0;
      *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
      pfVar2[0] = 0.0;
      pfVar2[1] = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
      *(undefined8 *)pfVar3 = 0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
      fVar26 = 1.0;
      fVar27 = 1.0;
      fVar28 = 1.0;
      fVar25 = 1.0;
    }
    pfVar12 = pfVar12 + 5;
    lVar17 = lVar17 + 1;
    puVar19 = puVar19 + 2;
    pfVar13 = pfVar13 + 4;
    uVar20 = uVar4;
    if ((fVar31 != 0.0) || (NAN(fVar31))) goto LAB_00157b16;
  }
  __return_storage_ptr__->x[1][1] = fVar28;
  __return_storage_ptr__->x[2][2] = fVar27;
  __return_storage_ptr__->x[3][3] = fVar26;
  __return_storage_ptr__->x[0][0] = fVar25;
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE inline Matrix44<T>
Matrix44<T>::gjInverse () const IMATH_NOEXCEPT
{
    int      i, j, k;
    Matrix44 s;
    Matrix44 t (*this);

    // Forward elimination

    for (i = 0; i < 3; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 4; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0) { return Matrix44 (); }

        if (pivot != i)
        {
            for (j = 0; j < 4; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 4; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 3; i >= 0; --i)
    {
        T f;

        if ((f = t.x[i][i]) == 0) { return Matrix44 (); }

        for (j = 0; j < 4; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}